

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall
icu_63::DecimalFormat::applyPattern(DecimalFormat *this,UnicodeString *pattern,UErrorCode *status)

{
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    icu_63::number::impl::PatternParser::parseToExistingProperties
              (pattern,(this->fields->properties).
                       super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr,
               IGNORE_ROUNDING_NEVER,status);
  }
  touch(this,status);
  return;
}

Assistant:

void DecimalFormat::applyPattern(const UnicodeString& pattern, UErrorCode& status) {
    setPropertiesFromPattern(pattern, IGNORE_ROUNDING_NEVER, status);
    touch(status);
}